

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_test_properties.hpp
# Opt level: O0

void run_map_test<boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>>
               (void)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  il;
  bool v;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  iterator local_68;
  size_type local_60;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  local_58;
  allocator<char> local_29;
  string local_28;
  
  run_common_test<boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>>
            ();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             "\n                                 k=v\n                                 k=v2\n                                 "
             ,&local_29);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[2],_const_char_(&)[2],_true>
            (&local_a8,(char (*) [2])0x179a0d,(char (*) [2])"v");
  local_68 = &local_a8;
  local_60 = 1;
  il._M_len = 1;
  il._M_array = local_68;
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::flat_map(&local_58,il);
  v = properties_eq<boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>,boost::container::flat_map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,void>>
                (&local_28,&local_58);
  boost::detail::test_impl
            ("(properties_eq<T, V>(R\"(\n                                 k=v\n                                 k=v2\n                                 )\", {{\"k\", \"v\"}}))"
             ,
             "/workspace/llm4binary/github/license_c_cmakelists/glywk[P]cpp_properties/test/parser/common_test_properties.hpp"
             ,0x28,
             "void run_map_test() [T = boost::container::flat_map<std::basic_string<char>, std::basic_string<char>>, V = boost::container::flat_map<std::basic_string<char>, std::basic_string<char>>]"
             ,v);
  boost::container::
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_void>
  ::~flat_map(&local_58);
  local_c8 = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&local_68;
  do {
    local_c8 = local_c8 + -1;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_c8);
  } while (local_c8 != &local_a8);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  return;
}

Assistant:

void run_map_test() {

  run_common_test<T, V>();

  // duplicate keep first key insertion
  {
    BOOST_TEST((properties_eq<T, V>(R"(
                                 k=v
                                 k=v2
                                 )",
                                    {{"k", "v"}})));
  }
}